

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::LeaveIdleDecommit(Recycler *this)

{
  HANDLE pVVar1;
  code *pcVar2;
  bool bVar3;
  IdleDecommitSignal IVar4;
  int iVar5;
  undefined4 *puVar6;
  
  pVVar1 = this->concurrentIdleDecommitEvent;
  IVar4 = HeapInfoManager::LeaveIdleDecommit(&this->autoHeap,pVVar1 != (HANDLE)0x0);
  if (IVar4 == IdleDecommitSignal_None) {
    return;
  }
  if (pVVar1 == (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x439,"(allowTimer)","allowTimer");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (IVar4 != IdleDecommitSignal_NeedSignal) {
    LOCK();
    iVar5 = this->needIdleDecommitSignal;
    if (iVar5 == 0) {
      this->needIdleDecommitSignal = 1;
      iVar5 = 0;
    }
    UNLOCK();
    if (iVar5 != 2) {
      return;
    }
  }
  bVar3 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,IdleDecommitPhase);
  if (bVar3) {
    Output::Print(L"Recycler Thread IdleDecommit Need Signal\n");
    Output::Flush();
  }
  SetEvent(this->concurrentIdleDecommitEvent);
  return;
}

Assistant:

void
Recycler::LeaveIdleDecommit()
{
#ifdef IDLE_DECOMMIT_ENABLED
    bool allowTimer = (this->concurrentIdleDecommitEvent != nullptr);
    IdleDecommitSignal idleDecommitSignal = autoHeap.LeaveIdleDecommit(allowTimer);

    if (idleDecommitSignal != IdleDecommitSignal_None)
    {
        Assert(allowTimer);
        // Reduce the number of times we need to signal the background thread
        // by detecting whether the thread is waiting on a time out or not
        if (idleDecommitSignal == IdleDecommitSignal_NeedSignal ||
            ::InterlockedCompareExchange(&needIdleDecommitSignal, IdleDecommitSignal_NeedTimer, IdleDecommitSignal_None) == IdleDecommitSignal_NeedSignal)
        {
#if DBG
            if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::IdleDecommitPhase))
            {
                Output::Print(_u("Recycler Thread IdleDecommit Need Signal\n"));
                Output::Flush();
            }
#endif

#pragma prefast(suppress:6387, "INVALID_PARAM_VALUE_1 We will never reach here if concurrentIdleDecommitEvent is NULL.");
            SetEvent(this->concurrentIdleDecommitEvent);
        }
    }

#else
    autoHeap.LeaveIdleDecommit(false /*allowTimer*/);
#endif
}